

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

bool __thiscall
cmCMakePresetsGraph::ConfigurePreset::VisitPresetAfterInherit
          (ConfigurePreset *this,int version,cmJSONState *state)

{
  Preset *pPVar1;
  __optional_eq_t<bool,_bool> _Var2;
  ulong uVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
  *this_00;
  size_type sVar4;
  __optional_eq_t<bool,_bool> local_da;
  __optional_eq_t<bool,_bool> local_d9;
  allocator<char> local_b1;
  key_type local_b0;
  bool local_8d;
  bool local_8c;
  bool local_8b;
  bool local_8a;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  ConfigurePreset *local_30;
  ConfigurePreset *preset;
  cmJSONState *state_local;
  ConfigurePreset *pCStack_18;
  int version_local;
  ConfigurePreset *this_local;
  
  if (((this->super_Preset).Hidden & 1U) == 0) {
    local_30 = this;
    preset = (ConfigurePreset *)state;
    state_local._4_4_ = version;
    pCStack_18 = this;
    if (version < 3) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        pPVar1 = &local_30->super_Preset;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"generator",&local_51);
        cmCMakePresetsErrors::PRESET_MISSING_FIELD(&pPVar1->Name,&local_50,(cmJSONState *)preset);
        std::__cxx11::string::~string((string *)&local_50);
        std::allocator<char>::~allocator(&local_51);
        return false;
      }
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        pPVar1 = &local_30->super_Preset;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"binaryDir",&local_89);
        cmCMakePresetsErrors::PRESET_MISSING_FIELD(&pPVar1->Name,&local_88,(cmJSONState *)preset);
        std::__cxx11::string::~string((string *)&local_88);
        std::allocator<char>::~allocator(&local_89);
        return false;
      }
    }
    local_8a = false;
    _Var2 = std::operator==(&local_30->WarnDev,&local_8a);
    local_d9 = false;
    if (_Var2) {
      local_8b = true;
      local_d9 = std::operator==(&local_30->ErrorDev,&local_8b);
    }
    if (local_d9 != false) {
      return false;
    }
    local_8c = false;
    _Var2 = std::operator==(&local_30->WarnDeprecated,&local_8c);
    local_da = false;
    if (_Var2) {
      local_8d = true;
      local_da = std::operator==(&local_30->ErrorDeprecated,&local_8d);
    }
    if (local_da != false) {
      return false;
    }
    this_00 = &local_30->CacheVariables;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"",&local_b1);
    sVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
            ::count(this_00,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    if (sVar4 != 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool cmCMakePresetsGraph::ConfigurePreset::VisitPresetAfterInherit(
  int version, cmJSONState* state)
{
  auto& preset = *this;
  if (!preset.Hidden) {
    if (version < 3) {
      if (preset.Generator.empty()) {
        cmCMakePresetsErrors::PRESET_MISSING_FIELD(preset.Name, "generator",
                                                   state);
        return false;
      }
      if (preset.BinaryDir.empty()) {
        cmCMakePresetsErrors::PRESET_MISSING_FIELD(preset.Name, "binaryDir",
                                                   state);
        return false;
      }
    }

    if (preset.WarnDev == false && preset.ErrorDev == true) {
      return false;
    }
    if (preset.WarnDeprecated == false && preset.ErrorDeprecated == true) {
      return false;
    }
    if (preset.CacheVariables.count("") != 0) {
      return false;
    }
  }

  return true;
}